

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O3

void replace_port_zero(char *addr,char *buf,int port)

{
  bool bVar1;
  char cVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  char local_58 [8];
  char num [16];
  
  cVar2 = *addr;
  uVar4 = 0;
  if (cVar2 != '\0') {
    pcVar6 = addr + 1;
    bVar1 = false;
    do {
      iVar3 = (int)uVar4;
      bVar1 = (bool)(~bVar1 & 1U | cVar2 != '0');
      if (bVar1) {
        buf[iVar3] = cVar2;
        iVar5 = 1;
      }
      else {
        snprintf(local_58,0x10,"%d",(ulong)(uint)port);
        __n = strlen(local_58);
        iVar5 = (int)__n;
        memcpy(buf + iVar3,local_58,__n);
      }
      bVar1 = bVar1 && cVar2 == ':';
      uVar4 = (ulong)(uint)(iVar3 + iVar5);
      cVar2 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar2 != '\0');
    uVar4 = (ulong)(iVar3 + iVar5);
  }
  buf[uVar4] = '\0';
  return;
}

Assistant:

static void
replace_port_zero(const char *addr, char *buf, int port)
{
	int  i;
	int  j;
	bool colon = false;
	char c;

	for (i = 0, j = 0; (c = addr[i]) != '\0'; i++) {

		if (colon && c == '0') {
			char num[16];
			(void) snprintf(num, sizeof(num), "%d", port);
			memcpy(&buf[j], num, strlen(num));
			j += (int) strlen(num);
			colon = false;
			continue;
		}
		colon    = c == ':';
		buf[j++] = c;
	}
	buf[j] = '\0';
}